

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void __thiscall Test_Template_Section::Test_Template_Section(Test_Template_Section *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, Section) {
  Template* tpl = StringToTemplate(
      "boo!\nhi {{#SEC}}lo{{#SUBSEC}}jo{{/SUBSEC}}{{/SEC}} bar",
      STRIP_WHITESPACE);
  TemplateDictionary dict("dict");
  AssertExpandIs(tpl, &dict, "boo!hi  bar", true);
  dict.ShowSection("SEC");
  AssertExpandIs(tpl, &dict, "boo!hi lo bar", true);
  dict.ShowSection("SEC");
  AssertExpandIs(tpl, &dict, "boo!hi lo bar", true);
  // This should work even though subsec isn't a child of the main dict
  dict.ShowSection("SUBSEC");
  AssertExpandIs(tpl, &dict, "boo!hi lojo bar", true);

  TemplateDictionary dict2("dict2");
  dict2.AddSectionDictionary("SEC");
  AssertExpandIs(tpl, &dict2, "boo!hi lo bar", true);
  dict2.AddSectionDictionary("SEC");
  AssertExpandIs(tpl, &dict2, "boo!hi lolo bar", true);
  dict2.AddSectionDictionary("sec");
  AssertExpandIs(tpl, &dict2, "boo!hi lolo bar", true);
  dict2.ShowSection("SUBSEC");
  AssertExpandIs(tpl, &dict2, "boo!hi lojolojo bar", true);
}